

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

Fra_Lcr_t * Lcr_ManAlloc(Aig_Man_t *pAig)

{
  Fra_Lcr_t *pFVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  size_t __size;
  
  pFVar1 = (Fra_Lcr_t *)calloc(1,0x88);
  pFVar1->pAig = pAig;
  __size = (long)pAig->nObjs[2] << 2;
  piVar2 = (int *)calloc(1,__size);
  pFVar1->pInToOutPart = piVar2;
  piVar2 = (int *)calloc(1,__size);
  pFVar1->pInToOutNum = piVar2;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  pFVar1->vFraigs = pVVar3;
  return pFVar1;
}

Assistant:

Fra_Lcr_t * Lcr_ManAlloc( Aig_Man_t * pAig )
{
    Fra_Lcr_t * p;
    p = ABC_ALLOC( Fra_Lcr_t, 1 );
    memset( p, 0, sizeof(Fra_Lcr_t) );
    p->pAig = pAig;
    p->pInToOutPart = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutPart, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->pInToOutNum = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
    memset( p->pInToOutNum, 0, sizeof(int) * Aig_ManCiNum(pAig) );
    p->vFraigs = Vec_PtrAlloc( 1000 );
    return p;
}